

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

size_t EmitArgsWithArgOutsAtEnd
                 (ParseNode *pnode,BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,
                 FuncInfo *funcInfo,ProfileId callSiteId,RegSlot thisLocation,
                 ArgSlot argsCountForStartCall,bool emitProfiledArgouts,
                 AuxArray<unsigned_int> *spreadIndices)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ByteCodeWriter *pBVar6;
  ushort local_4c;
  ushort local_4a;
  ArgSlot index_1;
  ArgSlot index;
  RegSlot firstArgTempLocation;
  RegSlot argTempLocation;
  RegSlot RStack_38;
  ArgSlot spreadIndex;
  ArgSlot argIndex;
  ProfileId PStack_32;
  bool emitProfiledArgouts_local;
  RegSlot thisLocation_local;
  ProfileId callSiteId_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodePtr pPStack_18;
  BOOL fAssignRegs_local;
  ParseNode *pnode_local;
  
  argTempLocation._3_1_ = emitProfiledArgouts;
  RStack_38 = thisLocation;
  PStack_32 = callSiteId;
  _thisLocation_local = funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local._4_4_ = fAssignRegs;
  pPStack_18 = pnode;
  if (pnode == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1d3a,"(pnode != nullptr)","pnode != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  argTempLocation._0_2_ = 0;
  firstArgTempLocation._2_2_ = 0;
  RVar3 = FuncInfo::AcquireTmpRegister(_thisLocation_local);
  _index_1 = RVar3;
  while (pPStack_18->nop == knopList) {
    pPVar5 = ParseNode::AsParseNodeBin(pPStack_18);
    EmitOneArg(pPVar5->pnode1,byteCodeGenerator_local._4_4_,(ByteCodeGenerator *)funcInfo_local,
               _thisLocation_local,PStack_32,(ArgSlot *)&argTempLocation,
               (ArgSlot *)((long)&firstArgTempLocation + 2),_index_1,false,spreadIndices);
    pPVar5 = ParseNode::AsParseNodeBin(pPStack_18);
    pPStack_18 = pPVar5->pnode2;
    _index_1 = FuncInfo::AcquireTmpRegister(_thisLocation_local);
  }
  EmitOneArg(pPStack_18,byteCodeGenerator_local._4_4_,(ByteCodeGenerator *)funcInfo_local,
             _thisLocation_local,PStack_32,(ArgSlot *)&argTempLocation,
             (ArgSlot *)((long)&firstArgTempLocation + 2),_index_1,false,spreadIndices);
  pBVar6 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
  Js::ByteCodeWriter::StartCall(pBVar6,StartCall,argsCountForStartCall);
  if (RStack_38 != 0xffffffff) {
    pBVar6 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::ArgOut<true>(pBVar6,0,RStack_38,PStack_32,false);
  }
  for (local_4a = 0; local_4a < (ushort)argTempLocation; local_4a = local_4a + 1) {
    pBVar6 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::ArgOut<true>
              (pBVar6,local_4a + 1,RVar3 + local_4a,PStack_32,(bool)(argTempLocation._3_1_ & 1));
  }
  for (local_4c = (ushort)argTempLocation; local_4c != 0; local_4c = local_4c - 1) {
    FuncInfo::ReleaseTmpRegister(_thisLocation_local,_index_1);
    _index_1 = _index_1 - 1;
  }
  return (ulong)(ushort)argTempLocation;
}

Assistant:

size_t EmitArgsWithArgOutsAtEnd(
    ParseNode *pnode,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::RegSlot thisLocation,
    Js::ArgSlot argsCountForStartCall,
    bool emitProfiledArgouts,
    Js::AuxArray<uint32> *spreadIndices = nullptr
)
{
    AssertOrFailFast(pnode != nullptr);

    Js::ArgSlot argIndex = 0;
    Js::ArgSlot spreadIndex = 0;

    Js::RegSlot argTempLocation = funcInfo->AcquireTmpRegister();
    Js::RegSlot firstArgTempLocation = argTempLocation;

    while (pnode->nop == knopList)
    {
        EmitOneArg(pnode->AsParseNodeBin()->pnode1, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, argTempLocation, false /*emitProfiledArgout*/, spreadIndices);
        pnode = pnode->AsParseNodeBin()->pnode2;
        argTempLocation = funcInfo->AcquireTmpRegister();
    }

    EmitOneArg(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, argTempLocation, false /*emitProfiledArgout*/, spreadIndices);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, argsCountForStartCall);

    // Emit all argOuts now

    if (thisLocation != Js::Constants::NoRegister)
    {
        // Emit the "this" object.
        byteCodeGenerator->Writer()->ArgOut<true>(0, thisLocation, callSiteId, false /*emitProfiledArgouts*/);
    }

    for (Js::ArgSlot index = 0; index < argIndex; index++)
    {
        byteCodeGenerator->Writer()->ArgOut<true>(index + 1, firstArgTempLocation + index, callSiteId, emitProfiledArgouts);
    }

    // Now release all those temps register
    for (Js::ArgSlot index = argIndex; index > 0; index--)
    {
        funcInfo->ReleaseTmpRegister(argTempLocation--);
    }

    return argIndex;
}